

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartHelper.h
# Opt level: O3

string * __thiscall
Imf_2_5::MultiViewChannelName::getSuffix_abi_cxx11_
          (string *__return_storage_ptr__,MultiViewChannelName *this)

{
  pointer pcVar1;
  long lVar2;
  
  lVar2 = std::__cxx11::string::rfind((char)&this->name,0x2e);
  if (lVar2 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->name)._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getSuffix() const
  {
        std::size_t q=name.rfind('.');
	if(  q==name.npos  )
	{
	    return name;
	}
	return name.substr(q+1);
      
  }